

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O1

int If_DsdManCheckNonDec_rec(If_DsdMan_t *p,int Id)

{
  void *pvVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  
  if ((Id < 0) || ((p->vObjs).nSize <= Id)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pvVar1 = (p->vObjs).pArray[(uint)Id];
  uVar2 = *(uint *)((long)pvVar1 + 4) & 7;
  iVar5 = 0;
  if (1 < uVar2 - 1) {
    if (uVar2 == 6) {
LAB_0039fc43:
      iVar5 = 1;
    }
    else {
      iVar5 = 0;
      if (0x7ffffff < *(uint *)((long)pvVar1 + 4)) {
        iVar5 = 0;
        uVar4 = 0;
        do {
          uVar2 = *(uint *)((long)pvVar1 + uVar4 * 4 + 8);
          if (uVar2 == 0) {
            return 0;
          }
          if ((int)uVar2 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                          ,0xf2,"int Abc_Lit2Var(int)");
          }
          iVar3 = If_DsdManCheckNonDec_rec(p,uVar2 >> 1);
          if (iVar3 != 0) goto LAB_0039fc43;
          uVar4 = uVar4 + 1;
        } while (uVar4 < *(uint *)((long)pvVar1 + 4) >> 0x1b);
      }
    }
  }
  return iVar5;
}

Assistant:

int If_DsdManCheckNonDec_rec( If_DsdMan_t * p, int Id )
{
    If_DsdObj_t * pObj;
    int i, iFanin;
    pObj = If_DsdVecObj( &p->vObjs, Id );
    if ( If_DsdObjType(pObj) == IF_DSD_CONST0 )
        return 0;
    if ( If_DsdObjType(pObj) == IF_DSD_VAR )
        return 0;
    if ( If_DsdObjType(pObj) == IF_DSD_PRIME )
        return 1;
    If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
        if ( If_DsdManCheckNonDec_rec( p, Abc_Lit2Var(iFanin) ) )
            return 1;
    return 0;
}